

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O2

void __thiscall tst_helpers_connect::rejectOneSenderManyArgs(tst_helpers_connect *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  QThread *p_00;
  QObject *pQVar4;
  QEvent *this_00;
  offset_in_Object_to_subr in_RCX;
  bool local_51;
  QWeakPointer<QObject> local_50;
  PromiseFromSignal<void_(Object::*)()> p;
  Object sender;
  
  Object::Object(&sender);
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_50,p_00);
  if (((local_50.d != (Data *)0x0) &&
      (iVar3 = *(int *)(local_50.d + 4),
      in_RCX = (offset_in_Object_to_subr)CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0),
      local_50.value != (QObject *)0x0 && iVar3 != 0)) &&
     (cVar1 = QThread::isFinished(), cVar1 == '\0')) {
    if ((local_50.d == (Data *)0x0) || (*(int *)(local_50.d + 4) == 0)) {
      local_50.value = (QObject *)0x0;
    }
    pQVar4 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_50.value);
    if ((pQVar4 != (QObject *)0x0) || (cVar1 = QCoreApplication::closingDown(), cVar1 == '\0')) {
      this_00 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_00127458;
      *(Object **)(this_00 + 0x10) = &sender;
      QCoreApplication::postEvent(pQVar4,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_50);
  local_50.d = (Data *)Object::twoArgsSignal;
  local_50.value = (QObject *)0x0;
  QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)&sender,&sender,in_RCX);
  local_50.d = (Data *)CONCAT71(local_50.d._1_7_,0 < sender.m_connections);
  local_51 = true;
  bVar2 = QTest::qCompare<bool,bool>
                    ((bool *)&local_50,&local_51,"sender.hasConnections()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x7c);
  if (bVar2) {
    bVar2 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    local_50.d = (Data *)CONCAT71(local_50.d._1_7_,bVar2);
    local_51 = true;
    bVar2 = QTest::qCompare<bool,bool>
                      ((bool *)&local_50,&local_51,"p.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x7d);
    if (bVar2) {
      local_50.d = (Data *)CONCAT44(local_50.d._4_4_,0xffffffff);
      iVar3 = waitForError<int>(&p,(int *)&local_50);
      cVar1 = QTest::qCompare(iVar3,0x2a,"waitForError(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                              ,0x7e);
      if (cVar1 != '\0') {
        local_50.d = (Data *)CONCAT71(local_50.d._1_7_,0 < sender.m_connections);
        local_51 = false;
        QTest::qCompare<bool,bool>
                  ((bool *)&local_50,&local_51,"sender.hasConnections()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                   ,0x7f);
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  QObject::~QObject(&sender.super_QObject);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderManyArgs()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.twoArgsSignal(42, "bar");
    });

    auto p = QtPromise::connect(&sender, &Object::noArgSignal, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, -1), 42);
    QCOMPARE(sender.hasConnections(), false);
}